

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::GLES2ThreadedSharingTest::iterate(GLES2ThreadedSharingTest *this)

{
  value_type pEVar1;
  deUint64 dVar2;
  bool bVar3;
  bool bVar4;
  ThreadStatus TVar5;
  int iVar6;
  deUint64 dVar7;
  size_type sVar8;
  reference ppEVar9;
  MessageBuilder *pMVar10;
  reference pvVar11;
  deUint64 dVar12;
  deUint64 dVar13;
  string *value;
  NotSupportedError *this_00;
  int local_580;
  ThreadStatus status;
  int threadNdx_6;
  bool notSupported;
  bool isOk;
  MessageBuilder local_570;
  unsigned_long local_3f0;
  MessageBuilder local_3e8;
  undefined1 local_268 [8];
  Message message;
  Message local_218;
  int local_1ec;
  int local_1e8;
  int threadNdx_5;
  int threadNdx_4;
  int firstThread;
  allocator<int> local_4d;
  value_type_conflict1 local_4c;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> indices;
  int local_28;
  int threadNdx_3;
  int threadNdx_2;
  int threadNdx_1;
  int readyThreads;
  int threadNdx;
  GLES2ThreadedSharingTest *this_local;
  
  if ((this->m_threadsStarted & 1U) == 0) {
    dVar7 = deGetMicroseconds();
    this->m_beginTimeUs = dVar7;
    for (threadNdx_1 = 0;
        sVar8 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::size(&this->m_threads), threadNdx_1 < (int)sVar8; threadNdx_1 = threadNdx_1 + 1) {
      ppEVar9 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,(long)threadNdx_1);
      tcu::ThreadUtil::Thread::exec(&(*ppEVar9)->super_Thread);
    }
    this->m_threadsStarted = true;
    this->m_threadsRunning = true;
  }
  if ((this->m_threadsRunning & 1U) != 0) {
    threadNdx_2 = 0;
    for (threadNdx_3 = 0;
        sVar8 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::size(&this->m_threads), threadNdx_3 < (int)sVar8; threadNdx_3 = threadNdx_3 + 1) {
      ppEVar9 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,(long)threadNdx_3);
      TVar5 = tcu::ThreadUtil::Thread::getStatus(&(*ppEVar9)->super_Thread);
      if (TVar5 != THREADSTATUS_RUNNING) {
        threadNdx_2 = threadNdx_2 + 1;
      }
    }
    sVar8 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::size(&this->m_threads);
    if (threadNdx_2 == (int)sVar8) {
      for (local_28 = 0;
          sVar8 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::size(&this->m_threads), local_28 < (int)sVar8; local_28 = local_28 + 1) {
        ppEVar9 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::operator[](&this->m_threads,(long)local_28);
        de::Thread::join((Thread *)*ppEVar9);
      }
      this->m_executionReady = true;
      this->m_requiresRestart = false;
    }
    dVar7 = deGetMicroseconds();
    if (this->m_timeOutUs < dVar7 - this->m_beginTimeUs) {
      for (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ = 0;
          iVar6 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar8 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::size(&this->m_threads), iVar6 < (int)sVar8;
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage._4_4_ + 1) {
        ppEVar9 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::operator[](&this->m_threads,
                               (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
        TVar5 = tcu::ThreadUtil::Thread::getStatus(&(*ppEVar9)->super_Thread);
        if (TVar5 != THREADSTATUS_RUNNING) {
          ppEVar9 = std::
                    vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ::operator[](&this->m_threads,
                                 (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_end_of_storage._4_4_);
          de::Thread::join((Thread *)*ppEVar9);
        }
      }
      this->m_executionReady = true;
      this->m_requiresRestart = true;
      dVar7 = deGetMicroseconds();
      this->m_timeOutTimeUs = dVar7;
    }
    else {
      deSleep(this->m_sleepTimeMs);
    }
  }
  if ((this->m_executionReady & 1U) == 0) {
    return CONTINUE;
  }
  sVar8 = std::
          vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
          ::size(&this->m_threads);
  local_4c = 0;
  std::allocator<int>::allocator(&local_4d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,sVar8,&local_4c,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  if (this->m_timeOutTimeUs != 0) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&threadNdx_4,this->m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&threadNdx_4,
                         (char (*) [95])
                         "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous."
                        );
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&threadNdx_4);
  }
  do {
    threadNdx_5 = -1;
    for (local_1e8 = 0; iVar6 = local_1e8,
        sVar8 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::size(&this->m_threads), iVar6 < (int)sVar8; local_1e8 = local_1e8 + 1) {
      ppEVar9 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,(long)local_1e8);
      iVar6 = tcu::ThreadUtil::Thread::getMessageCount(&(*ppEVar9)->super_Thread);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_48,(long)local_1e8);
      if (*pvVar11 < iVar6) {
        threadNdx_5 = local_1e8;
        break;
      }
    }
    if (threadNdx_5 == -1) {
      if (this->m_timeOutTimeUs != 0) {
        tcu::TestLog::operator<<(&local_570,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message)
        ;
        pMVar10 = tcu::MessageBuilder::operator<<(&local_570,(char (*) [2])0x2c3fdfc);
        _threadNdx_6 = this->m_timeOutTimeUs - this->m_beginTimeUs;
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(unsigned_long *)&threadNdx_6);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [34])"] Execution timeout limit reached");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_570);
      }
      bVar4 = true;
      bVar3 = false;
      for (local_580 = 0;
          sVar8 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::size(&this->m_threads), local_580 < (int)sVar8; local_580 = local_580 + 1) {
        ppEVar9 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::operator[](&this->m_threads,(long)local_580);
        TVar5 = tcu::ThreadUtil::Thread::getStatus(&(*ppEVar9)->super_Thread);
        switch(TVar5) {
        case THREADSTATUS_INIT_FAILED:
        case THREADSTATUS_RUNNING:
        case THREADSTATUS_FAILED:
          bVar4 = false;
          break;
        case THREADSTATUS_READY:
          break;
        case THREADSTATUS_NOT_SUPPORTED:
          bVar3 = true;
          break;
        default:
          bVar4 = false;
        }
      }
      if (!bVar3) {
        if (bVar4) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_48);
        return STOP;
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Thread threw tcu::NotSupportedError","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                 ,0xea5);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    for (local_1ec = 0; iVar6 = local_1ec,
        sVar8 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::size(&this->m_threads), iVar6 < (int)sVar8; local_1ec = local_1ec + 1) {
      ppEVar9 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,(long)local_1ec);
      iVar6 = tcu::ThreadUtil::Thread::getMessageCount(&(*ppEVar9)->super_Thread);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_48,(long)local_1ec);
      if (*pvVar11 < iVar6) {
        ppEVar9 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::operator[](&this->m_threads,(long)local_1ec);
        pEVar1 = *ppEVar9;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_48,(long)local_1ec);
        tcu::ThreadUtil::Thread::getMessage(&local_218,&pEVar1->super_Thread,*pvVar11);
        dVar12 = tcu::ThreadUtil::Message::getTime(&local_218);
        dVar7 = this->m_beginTimeUs;
        ppEVar9 = std::
                  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ::operator[](&this->m_threads,(long)threadNdx_5);
        pEVar1 = *ppEVar9;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_48,(long)threadNdx_5);
        tcu::ThreadUtil::Thread::getMessage
                  ((Message *)((long)&message.m_message.field_2 + 8),&pEVar1->super_Thread,*pvVar11)
        ;
        dVar13 = tcu::ThreadUtil::Message::getTime
                           ((Message *)((long)&message.m_message.field_2 + 8));
        dVar2 = this->m_beginTimeUs;
        tcu::ThreadUtil::Message::~Message((Message *)((long)&message.m_message.field_2 + 8));
        tcu::ThreadUtil::Message::~Message(&local_218);
        if (dVar12 - dVar7 < dVar13 - dVar2) {
          threadNdx_5 = local_1ec;
        }
      }
    }
    ppEVar9 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,(long)threadNdx_5);
    pEVar1 = *ppEVar9;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_48,(long)threadNdx_5);
    tcu::ThreadUtil::Thread::getMessage((Message *)local_268,&pEVar1->super_Thread,*pvVar11);
    tcu::TestLog::operator<<(&local_3e8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_3e8,(char (*) [2])0x2c3fdfc);
    dVar7 = tcu::ThreadUtil::Message::getTime((Message *)local_268);
    local_3f0 = dVar7 - this->m_beginTimeUs;
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3f0);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])"] (");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&threadNdx_5);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b56371);
    value = tcu::ThreadUtil::Message::getMessage_abi_cxx11_((Message *)local_268);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3e8);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_48,(long)threadNdx_5);
    *pvVar11 = *pvVar11 + 1;
    tcu::ThreadUtil::Message::~Message((Message *)local_268);
  } while( true );
}

Assistant:

tcu::TestCase::IterateResult GLES2ThreadedSharingTest::iterate (void)
{
	if (!m_threadsStarted)
	{
		m_beginTimeUs = deGetMicroseconds();

		// Execute threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->exec();

		m_threadsStarted = true;
		m_threadsRunning = true;
	}

	if (m_threadsRunning)
	{
		// Wait threads to finish
		int readyThreads = 0;
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
				readyThreads++;
		}

		if (readyThreads == (int)m_threads.size())
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				m_threads[threadNdx]->join();

			m_executionReady	= true;
			m_requiresRestart	= false;
		}

		if (deGetMicroseconds() - m_beginTimeUs > m_timeOutUs)
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
					m_threads[threadNdx]->join();
			}
			m_executionReady	= true;
			m_requiresRestart	= true;
			m_timeOutTimeUs		= deGetMicroseconds();
		}
		else
		{
			deSleep(m_sleepTimeMs);
		}
	}

	if (m_executionReady)
	{
		std::vector<int> indices(m_threads.size(), 0);

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous." << tcu::TestLog::EndMessage;

		while (true)
		{
			int			firstThread = -1;

			// Find first thread with messages
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getMessageCount() > indices[threadNdx])
				{
					firstThread = threadNdx;
					break;
				}
			}

			// No more messages
			if (firstThread == -1)
				break;

			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				// No more messages in this thread
				if (m_threads[threadNdx]->getMessageCount() <= indices[threadNdx])
					continue;

				if ((m_threads[threadNdx]->getMessage(indices[threadNdx]).getTime() - m_beginTimeUs) < (m_threads[firstThread]->getMessage(indices[firstThread]).getTime() - m_beginTimeUs))
					firstThread = threadNdx;
			}

			tcu::ThreadUtil::Message message = m_threads[firstThread]->getMessage(indices[firstThread]);

			m_log << tcu::TestLog::Message << "[" << (message.getTime() - m_beginTimeUs) << "] (" << firstThread << ") " << message.getMessage() << tcu::TestLog::EndMessage;
			indices[firstThread]++;
		}

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "[" << (m_timeOutTimeUs - m_beginTimeUs) << "] Execution timeout limit reached" << tcu::TestLog::EndMessage;

		bool isOk = true;
		bool notSupported = false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			const tcu::ThreadUtil::Thread::ThreadStatus status = m_threads[threadNdx]->getStatus();

			switch (status)
			{
				case tcu::ThreadUtil::Thread::THREADSTATUS_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_INIT_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING:
					isOk = false;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_NOT_SUPPORTED:
					notSupported = true;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_READY:
					// Nothing
					break;

				default:
					DE_ASSERT(false);
					isOk = false;
			};
		}

		if (notSupported)
			throw tcu::NotSupportedError("Thread threw tcu::NotSupportedError", "", __FILE__, __LINE__);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	return CONTINUE;
}